

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JoystickImpl.cpp
# Opt level: O1

void __thiscall sf::priv::JoystickImpl::JoystickImpl(JoystickImpl *this)

{
  this->m_file = -1;
  (this->m_state).connected = false;
  (this->m_state).axes[0] = 0.0;
  (this->m_state).axes[1] = 0.0;
  (this->m_state).axes[2] = 0.0;
  (this->m_state).axes[3] = 0.0;
  (this->m_state).axes[4] = 0.0;
  (this->m_state).axes[5] = 0.0;
  (this->m_state).axes[6] = 0.0;
  (this->m_state).axes[7] = 0.0;
  (this->m_state).buttons[0] = false;
  (this->m_state).buttons[1] = false;
  (this->m_state).buttons[2] = false;
  (this->m_state).buttons[3] = false;
  (this->m_state).buttons[4] = false;
  (this->m_state).buttons[5] = false;
  (this->m_state).buttons[6] = false;
  (this->m_state).buttons[7] = false;
  (this->m_state).buttons[8] = false;
  (this->m_state).buttons[9] = false;
  (this->m_state).buttons[10] = false;
  (this->m_state).buttons[0xb] = false;
  (this->m_state).buttons[0xc] = false;
  (this->m_state).buttons[0xd] = false;
  (this->m_state).buttons[0xe] = false;
  (this->m_state).buttons[0xf] = false;
  (this->m_state).buttons[0x10] = false;
  (this->m_state).buttons[0x11] = false;
  (this->m_state).buttons[0x12] = false;
  (this->m_state).buttons[0x13] = false;
  (this->m_state).buttons[0x14] = false;
  (this->m_state).buttons[0x15] = false;
  (this->m_state).buttons[0x16] = false;
  (this->m_state).buttons[0x17] = false;
  (this->m_state).buttons[0x18] = false;
  (this->m_state).buttons[0x19] = false;
  (this->m_state).buttons[0x1a] = false;
  (this->m_state).buttons[0x1b] = false;
  (this->m_state).buttons[0x1c] = false;
  (this->m_state).buttons[0x1d] = false;
  (this->m_state).buttons[0x1e] = false;
  (this->m_state).buttons[0x1f] = false;
  Joystick::Identification::Identification(&this->m_identification);
  this->m_mapping[0x30] = '\0';
  this->m_mapping[0x31] = '\0';
  this->m_mapping[0x32] = '\0';
  this->m_mapping[0x33] = '\0';
  this->m_mapping[0x34] = '\0';
  this->m_mapping[0x35] = '\0';
  this->m_mapping[0x36] = '\0';
  this->m_mapping[0x37] = '\0';
  this->m_mapping[0x38] = '\0';
  this->m_mapping[0x39] = '\0';
  this->m_mapping[0x3a] = '\0';
  this->m_mapping[0x3b] = '\0';
  this->m_mapping[0x3c] = '\0';
  this->m_mapping[0x3d] = '\0';
  this->m_mapping[0x3e] = '\0';
  this->m_mapping[0x3f] = '\0';
  this->m_mapping[0x20] = '\0';
  this->m_mapping[0x21] = '\0';
  this->m_mapping[0x22] = '\0';
  this->m_mapping[0x23] = '\0';
  this->m_mapping[0x24] = '\0';
  this->m_mapping[0x25] = '\0';
  this->m_mapping[0x26] = '\0';
  this->m_mapping[0x27] = '\0';
  this->m_mapping[0x28] = '\0';
  this->m_mapping[0x29] = '\0';
  this->m_mapping[0x2a] = '\0';
  this->m_mapping[0x2b] = '\0';
  this->m_mapping[0x2c] = '\0';
  this->m_mapping[0x2d] = '\0';
  this->m_mapping[0x2e] = '\0';
  this->m_mapping[0x2f] = '\0';
  this->m_mapping[0x10] = '\0';
  this->m_mapping[0x11] = '\0';
  this->m_mapping[0x12] = '\0';
  this->m_mapping[0x13] = '\0';
  this->m_mapping[0x14] = '\0';
  this->m_mapping[0x15] = '\0';
  this->m_mapping[0x16] = '\0';
  this->m_mapping[0x17] = '\0';
  this->m_mapping[0x18] = '\0';
  this->m_mapping[0x19] = '\0';
  this->m_mapping[0x1a] = '\0';
  this->m_mapping[0x1b] = '\0';
  this->m_mapping[0x1c] = '\0';
  this->m_mapping[0x1d] = '\0';
  this->m_mapping[0x1e] = '\0';
  this->m_mapping[0x1f] = '\0';
  this->m_mapping[0] = '\0';
  this->m_mapping[1] = '\0';
  this->m_mapping[2] = '\0';
  this->m_mapping[3] = '\0';
  this->m_mapping[4] = '\0';
  this->m_mapping[5] = '\0';
  this->m_mapping[6] = '\0';
  this->m_mapping[7] = '\0';
  this->m_mapping[8] = '\0';
  this->m_mapping[9] = '\0';
  this->m_mapping[10] = '\0';
  this->m_mapping[0xb] = '\0';
  this->m_mapping[0xc] = '\0';
  this->m_mapping[0xd] = '\0';
  this->m_mapping[0xe] = '\0';
  this->m_mapping[0xf] = '\0';
  return;
}

Assistant:

JoystickImpl::JoystickImpl() :
m_file(-1)
{
    std::fill(m_mapping, m_mapping + ABS_MAX + 1, 0);
}